

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O3

FT_Error ft_open_face_internal
                   (FT_Library library,FT_Open_Args *args,FT_Long face_index,FT_Face_conflict *aface
                   ,FT_Bool test_mac_fonts)

{
  undefined8 *puVar1;
  uint uVar2;
  FT_Memory pFVar3;
  FT_ListNode pFVar4;
  ulong uVar5;
  FT_Bitmap_Size *pFVar6;
  long lVar7;
  FT_Face_Internal pFVar8;
  bool bVar9;
  bool bVar10;
  FT_Stream pFVar11;
  FT_Face_conflict face_00;
  uint uVar12;
  int iVar13;
  FT_Error FVar14;
  unsigned_long uVar15;
  FT_Driver pFVar16;
  FT_ListNode pFVar17;
  short sVar18;
  FT_Memory pFVar19;
  char cVar20;
  FT_Library extraout_RDX;
  FT_Library extraout_RDX_00;
  FT_Library extraout_RDX_01;
  FT_Library extraout_RDX_02;
  FT_Library pFVar21;
  undefined8 uVar22;
  byte bVar23;
  FT_ListRec *pFVar24;
  FT_Int num_params;
  FT_Parameter *params;
  FT_Parameter *pFVar25;
  FT_Module *ppFVar26;
  long lVar27;
  FT_Driver pFVar28;
  bool external_stream;
  FT_Stream stream;
  FT_Face face;
  char *file_names [9];
  FT_Error errors [9];
  FT_Open_Args args2;
  FT_Long offsets [9];
  FT_Memory local_1c8;
  FT_Stream local_1c0;
  FT_Stream local_1a8;
  FT_Library local_1a0;
  FT_Face_conflict local_198;
  FT_Stream local_190;
  FT_Memory local_188;
  undefined8 local_180;
  FT_Driver local_178;
  FT_Open_Args *local_170;
  undefined8 local_168;
  char local_129;
  char local_11e;
  char local_116;
  byte local_115;
  byte local_114;
  byte local_113;
  byte local_112;
  FT_Error local_e8 [12];
  FT_Open_Args local_b8;
  FT_Long local_78 [9];
  
  local_1a8 = (FT_Stream)0x0;
  local_198 = (FT_Face)0x0;
  if (args == (FT_Open_Args *)0x0) {
    return 6;
  }
  if (-1 < face_index && aface == (FT_Face_conflict *)0x0) {
    return 6;
  }
  if ((args->flags & 2) == 0) {
    external_stream = false;
  }
  else {
    external_stream = args->stream != (FT_Stream)0x0;
  }
  uVar12 = FT_Stream_New(library,args,&local_1a8);
  local_1a0 = library;
  if (uVar12 == 0) {
    local_1c8 = library->memory;
    if (((args->flags & 8) == 0) || (pFVar28 = (FT_Driver)args->driver, pFVar28 == (FT_Driver)0x0))
    {
      uVar2 = library->num_modules;
      if ((ulong)uVar2 != 0) {
        ppFVar26 = library->modules;
        uVar12 = 0xb;
        pFVar16 = (FT_Driver)0x0;
        pFVar21 = library;
        do {
          pFVar28 = (FT_Driver)*ppFVar26;
          if ((((pFVar28->root).clazz)->module_flags & 1) != 0) {
            if ((args->flags & 0x10) == 0) {
              params = (FT_Parameter *)0x0;
              pFVar25 = (FT_Parameter *)0x0;
            }
            else {
              params = (FT_Parameter *)(ulong)(uint)args->num_params;
              pFVar25 = args->params;
            }
            uVar12 = open_face(pFVar28,&local_1a8,external_stream,face_index,(FT_Int)params,pFVar25,
                               &local_198);
            if (uVar12 == 0) goto LAB_00133b12;
            pFVar21 = extraout_RDX_00;
            if (((test_mac_fonts != '\0') &&
                (iVar13 = strcmp((*ppFVar26)->clazz->module_name,"truetype"), local_1c0 = local_1a8,
                pFVar21 = extraout_RDX_01, (char)uVar12 == -0x72)) && (iVar13 == 0)) {
              if ((local_1a8->read != (FT_Stream_IoFunc)0x0) &&
                 (uVar15 = (*local_1a8->read)(local_1a8,0,(uchar *)0x0,0), uVar15 != 0))
              goto LAB_001335d9;
              local_1c0->pos = 0;
              uVar12 = open_face_PS_from_sfnt_stream
                                 (local_1a0,local_1c0,face_index,(FT_Int)aface,params,
                                  (FT_Face_conflict *)pFVar25);
              pFVar21 = extraout_RDX_02;
              if (uVar12 == 0) {
                pFVar3 = local_1c0->memory;
                if (local_1c0->close != (FT_Stream_CloseFunc)0x0) {
                  (*local_1c0->close)(local_1c0);
                }
                goto joined_r0x00133c17;
              }
            }
            pFVar16 = pFVar28;
            if ((char)uVar12 != '\x02') break;
          }
          ppFVar26 = ppFVar26 + 1;
          pFVar28 = pFVar16;
        } while (ppFVar26 < library->modules + uVar2);
        goto LAB_001335a7;
      }
      pFVar28 = (FT_Driver)0x0;
      uVar12 = 0xb;
    }
    else {
      uVar12 = 0x20;
      if ((((pFVar28->root).clazz)->module_flags & 1) != 0) {
        if ((args->flags & 0x10) == 0) {
          num_params = 0;
          pFVar25 = (FT_Parameter *)0x0;
        }
        else {
          num_params = args->num_params;
          pFVar25 = args->params;
        }
        uVar12 = open_face(pFVar28,&local_1a8,external_stream,face_index,num_params,pFVar25,
                           &local_198);
        if (uVar12 == 0) {
LAB_00133b12:
          pFVar17 = (FT_ListNode)(*local_1c8->alloc)(local_1c8,0x18);
          face_00 = local_198;
          if (pFVar17 != (FT_ListNode)0x0) {
            pFVar17->prev = (FT_ListNode)0x0;
            pFVar17->next = (FT_ListNode)0x0;
            pFVar17->data = local_198;
            pFVar28 = local_198->driver;
            pFVar4 = (pFVar28->faces_list).tail;
            pFVar24 = (FT_ListRec *)&pFVar4->next;
            if (pFVar4 == (FT_ListNode)0x0) {
              pFVar24 = &pFVar28->faces_list;
            }
            pFVar17->prev = pFVar4;
            pFVar24->head = pFVar17;
            (pFVar28->faces_list).tail = pFVar17;
            if (-1 < face_index) {
              FVar14 = FT_New_GlyphSlot(local_198,(FT_GlyphSlot *)0x0);
              if ((FVar14 != 0) ||
                 (FVar14 = FT_New_Size(face_00,(FT_Size *)&local_168), FVar14 != 0)) {
                FT_Done_Face(face_00);
                return FVar14;
              }
              face_00->size =
                   (FT_Size)CONCAT62(local_168._2_6_,CONCAT11(local_168._1_1_,(FT_Byte)local_168));
            }
            uVar5 = face_00->face_flags;
            if ((uVar5 & 1) != 0) {
              sVar18 = face_00->height;
              if (sVar18 < 0) {
                sVar18 = -sVar18;
                face_00->height = sVar18;
              }
              if ((uVar5 & 0x20) == 0) {
                face_00->max_advance_height = sVar18;
              }
            }
            if (((uVar5 & 2) != 0) && (iVar13 = face_00->num_fixed_sizes, 0 < (long)iVar13)) {
              pFVar6 = face_00->available_sizes;
              lVar27 = 0;
              do {
                sVar18 = *(short *)((long)&pFVar6->height + lVar27);
                if (sVar18 < 0) {
                  sVar18 = -sVar18;
                  *(short *)((long)&pFVar6->height + lVar27) = sVar18;
                  bVar23 = (byte)((ushort)sVar18 >> 0xf);
                }
                else {
                  bVar23 = 0;
                }
                lVar7 = *(long *)((long)&pFVar6->x_ppem + lVar27);
                if (lVar7 < 0) {
                  *(long *)((long)&pFVar6->x_ppem + lVar27) = -lVar7;
                }
                lVar7 = *(long *)((long)&pFVar6->y_ppem + lVar27);
                if (lVar7 < 0) {
                  *(long *)((long)&pFVar6->y_ppem + lVar27) = -lVar7;
                }
                if (bVar23 != 0) {
                  *(undefined4 *)((long)&pFVar6->height + lVar27) = 0;
                  puVar1 = (undefined8 *)((long)&pFVar6->size + lVar27);
                  *puVar1 = 0;
                  puVar1[1] = 0;
                  *(undefined8 *)((long)&pFVar6->y_ppem + lVar27) = 0;
                }
                lVar27 = lVar27 + 0x20;
              } while ((long)iVar13 * 0x20 != lVar27);
            }
            pFVar8 = face_00->internal;
            (pFVar8->transform_matrix).xx = 0x10000;
            (pFVar8->transform_matrix).xy = 0;
            (pFVar8->transform_matrix).yx = 0;
            (pFVar8->transform_matrix).yy = 0x10000;
            (pFVar8->transform_delta).x = 0;
            (pFVar8->transform_delta).y = 0;
            pFVar8->refcount = 1;
            pFVar8->no_stem_darkening = -1;
            if (aface == (FT_Face_conflict *)0x0) {
              FT_Done_Face(face_00);
            }
            else {
              *aface = face_00;
            }
            return 0;
          }
          uVar12 = 0x40;
          goto LAB_00133ae6;
        }
      }
    }
  }
  else {
    local_1c8 = (FT_Memory)0x0;
    pFVar21 = extraout_RDX;
    pFVar28 = (FT_Driver)0x0;
LAB_001335a7:
    if ((((char)uVar12 == '\x02') || ((uVar12 & 0xff) == 0x55)) || ((uVar12 & 0xff) == 0x51)) {
      if (test_mac_fonts != '\0') {
        local_1c0 = local_1a8;
        if (local_1a8 == (FT_Stream)0x0) {
          uVar22 = CONCAT71((int7)((ulong)pFVar21 >> 8),1);
          local_1c0 = (FT_Stream)0x0;
LAB_001337c6:
          uVar12 = 0x55;
LAB_001337cb:
          if ((args->flags & 4) != 0) {
            pFVar3 = local_1a0->memory;
            local_190 = (FT_Stream)0x0;
            local_180 = uVar22;
            local_178 = pFVar28;
            local_170 = args;
            FT_Raccess_Guess(local_1a0,local_1c0,args->pathname,(char **)&local_168,local_78,
                             local_e8);
            iVar13 = 2;
            lVar27 = 0;
            bVar9 = false;
            do {
              pFVar21 = local_1a0;
              uVar12 = (&ft_raccess_guess_table[0].type)[lVar27] + ~FT_RFork_Rule_darwin_ufs_export;
              bVar10 = bVar9;
              if (((1 < uVar12) || (!bVar9)) && (*(int *)((long)local_e8 + lVar27) == 0)) {
                local_b8.flags = 4;
                local_b8.pathname = *(FT_String **)((long)&local_168 + lVar27 * 2);
                if (local_b8.pathname == (FT_String *)0x0) {
                  local_b8.pathname = local_170->pathname;
                }
                iVar13 = FT_Stream_New(local_1a0,&local_b8,&local_190);
                pFVar11 = local_190;
                if ((char)iVar13 == 'Q') {
                  bVar10 = true;
                }
                if (1 < uVar12) {
                  bVar10 = bVar9;
                }
                if (iVar13 == 0) {
                  iVar13 = IsMacResource(pFVar21,local_190,*(FT_Long *)((long)local_78 + lVar27 * 2)
                                         ,face_index,aface);
                  if (pFVar11 != (FT_Stream)0x0) {
                    pFVar19 = pFVar11->memory;
                    if (pFVar11->close != (FT_Stream_CloseFunc)0x0) {
                      local_188 = pFVar11->memory;
                      (*pFVar11->close)(pFVar11);
                      pFVar19 = local_188;
                    }
                    (*pFVar19->free)(pFVar19,pFVar11);
                  }
                  if (iVar13 == 0) {
                    iVar13 = 0;
                    break;
                  }
                  bVar10 = bVar9;
                  if (uVar12 < 2) {
                    bVar10 = true;
                  }
                }
              }
              bVar9 = bVar10;
              lVar27 = lVar27 + 4;
            } while (lVar27 != 0x24);
            lVar27 = 0;
            do {
              if ((void *)(&local_168)[lVar27] != (void *)0x0) {
                (*pFVar3->free)(pFVar3,(void *)(&local_168)[lVar27]);
                (&local_168)[lVar27] = 0;
              }
              lVar27 = lVar27 + 1;
            } while (lVar27 != 9);
            cVar20 = (char)local_180;
            pFVar28 = local_178;
            uVar12 = 2;
            if (iVar13 == 0) goto LAB_00133a34;
            goto LAB_00133aba;
          }
        }
        else {
LAB_001335d9:
          if ((local_1c0->read != (FT_Stream_IoFunc)0x0) &&
             (uVar15 = (*local_1c0->read)(local_1c0,0,(uchar *)0x0,0), uVar15 != 0)) {
            uVar22 = 0;
            goto LAB_001337c6;
          }
          local_1c0->pos = 0;
          uVar12 = FT_Stream_Read(local_1c0,(FT_Byte *)&local_168,0x80);
          if (uVar12 == 0) {
            if ((((FT_Byte)local_168 == '\0') && (local_11e == '\0')) &&
               ((local_116 == '\0' &&
                (((0xde < (byte)(local_168._1_1_ - 0x22) && (local_129 == '\0')) &&
                 (-1 < (char)local_115 &&
                  *(FT_Byte *)((long)&local_168 + (ulong)local_168._1_1_ + 2) == '\0')))))) {
              uVar12 = IsMacResource(local_1a0,local_1c0,
                                     ((ulong)((uint)local_113 << 8 |
                                             (uint)local_114 << 0x10 | (uint)local_115 << 0x18) +
                                      (ulong)local_112 + 0x7f & 0xffffffffffffff80) + 0x80,
                                     face_index,aface);
              goto LAB_001337ad;
            }
LAB_001339ea:
            uVar12 = IsMacResource(local_1a0,local_1c0,0,face_index,aface);
          }
          else {
LAB_001337ad:
            if ((char)uVar12 == '\x02') goto LAB_001339ea;
          }
          uVar22 = 0;
          if (((char)uVar12 == 'U') || ((uVar12 & 0xff) == 2)) goto LAB_001337cb;
        }
        cVar20 = (char)uVar22;
        if (uVar12 == 0) {
LAB_00133a34:
          if (cVar20 != '\0') {
            return 0;
          }
          pFVar3 = local_1c0->memory;
          if (local_1c0->close != (FT_Stream_CloseFunc)0x0) {
            (*local_1c0->close)(local_1c0);
          }
joined_r0x00133c17:
          if (external_stream != false) {
            return 0;
          }
          (*pFVar3->free)(pFVar3,local_1c0);
          return 0;
        }
      }
      if ((char)uVar12 == '\x02') {
        uVar12 = 2;
      }
    }
  }
LAB_00133aba:
  pFVar11 = local_1a8;
  if (local_1a8 != (FT_Stream)0x0) {
    pFVar3 = local_1a8->memory;
    if (local_1a8->close != (FT_Stream_CloseFunc)0x0) {
      (*local_1a8->close)(local_1a8);
    }
    if (external_stream == false) {
      (*pFVar3->free)(pFVar3,pFVar11);
    }
  }
LAB_00133ae6:
  if (local_198 != (FT_Face)0x0) {
    destroy_face(local_1c8,local_198,pFVar28);
  }
  return uVar12;
}

Assistant:

static FT_Error
  ft_open_face_internal( FT_Library           library,
                         const FT_Open_Args*  args,
                         FT_Long              face_index,
                         FT_Face             *aface,
                         FT_Bool              test_mac_fonts )
  {
    FT_Error     error;
    FT_Driver    driver = NULL;
    FT_Memory    memory = NULL;
    FT_Stream    stream = NULL;
    FT_Face      face   = NULL;
    FT_ListNode  node   = NULL;
    FT_Bool      external_stream;
    FT_Module*   cur;
    FT_Module*   limit;

#ifndef FT_CONFIG_OPTION_MAC_FONTS
    FT_UNUSED( test_mac_fonts );
#endif


#ifdef FT_DEBUG_LEVEL_TRACE
    FT_TRACE3(( "FT_Open_Face: " ));
    if ( face_index < 0 )
      FT_TRACE3(( "Requesting number of faces and named instances\n"));
    else
    {
      FT_TRACE3(( "Requesting face %ld", face_index & 0xFFFFL ));
      if ( face_index & 0x7FFF0000L )
        FT_TRACE3(( ", named instance %ld", face_index >> 16 ));
      FT_TRACE3(( "\n" ));
    }
#endif

    /* test for valid `library' delayed to `FT_Stream_New' */

    if ( ( !aface && face_index >= 0 ) || !args )
      return FT_THROW( Invalid_Argument );

    external_stream = FT_BOOL( ( args->flags & FT_OPEN_STREAM ) &&
                               args->stream                     );

    /* create input stream */
    error = FT_Stream_New( library, args, &stream );
    if ( error )
      goto Fail3;

    memory = library->memory;

    /* If the font driver is specified in the `args' structure, use */
    /* it.  Otherwise, we scan the list of registered drivers.      */
    if ( ( args->flags & FT_OPEN_DRIVER ) && args->driver )
    {
      driver = FT_DRIVER( args->driver );

      /* not all modules are drivers, so check... */
      if ( FT_MODULE_IS_DRIVER( driver ) )
      {
        FT_Int         num_params = 0;
        FT_Parameter*  params     = NULL;


        if ( args->flags & FT_OPEN_PARAMS )
        {
          num_params = args->num_params;
          params     = args->params;
        }

        error = open_face( driver, &stream, external_stream, face_index,
                           num_params, params, &face );
        if ( !error )
          goto Success;
      }
      else
        error = FT_THROW( Invalid_Handle );

      FT_Stream_Free( stream, external_stream );
      goto Fail;
    }
    else
    {
      error = FT_ERR( Missing_Module );

      /* check each font driver for an appropriate format */
      cur   = library->modules;
      limit = cur + library->num_modules;

      for ( ; cur < limit; cur++ )
      {
        /* not all modules are font drivers, so check... */
        if ( FT_MODULE_IS_DRIVER( cur[0] ) )
        {
          FT_Int         num_params = 0;
          FT_Parameter*  params     = NULL;


          driver = FT_DRIVER( cur[0] );

          if ( args->flags & FT_OPEN_PARAMS )
          {
            num_params = args->num_params;
            params     = args->params;
          }

          error = open_face( driver, &stream, external_stream, face_index,
                             num_params, params, &face );
          if ( !error )
            goto Success;

#ifdef FT_CONFIG_OPTION_MAC_FONTS
          if ( test_mac_fonts                                           &&
               ft_strcmp( cur[0]->clazz->module_name, "truetype" ) == 0 &&
               FT_ERR_EQ( error, Table_Missing )                        )
          {
            /* TrueType but essential tables are missing */
            error = FT_Stream_Seek( stream, 0 );
            if ( error )
              break;

            error = open_face_PS_from_sfnt_stream( library,
                                                   stream,
                                                   face_index,
                                                   num_params,
                                                   params,
                                                   aface );
            if ( !error )
            {
              FT_Stream_Free( stream, external_stream );
              return error;
            }
          }
#endif

          if ( FT_ERR_NEQ( error, Unknown_File_Format ) )
            goto Fail3;
        }
      }

    Fail3:
      /* If we are on the mac, and we get an                          */
      /* FT_Err_Invalid_Stream_Operation it may be because we have an */
      /* empty data fork, so we need to check the resource fork.      */
      if ( FT_ERR_NEQ( error, Cannot_Open_Stream )       &&
           FT_ERR_NEQ( error, Unknown_File_Format )      &&
           FT_ERR_NEQ( error, Invalid_Stream_Operation ) )
        goto Fail2;

#if !defined( FT_MACINTOSH ) && defined( FT_CONFIG_OPTION_MAC_FONTS )
      if ( test_mac_fonts )
      {
        error = load_mac_face( library, stream, face_index, aface, args );
        if ( !error )
        {
          /* We don't want to go to Success here.  We've already done   */
          /* that.  On the other hand, if we succeeded we still need to */
          /* close this stream (we opened a different stream which      */
          /* extracted the interesting information out of this stream   */
          /* here.  That stream will still be open and the face will    */
          /* point to it).                                              */
          FT_Stream_Free( stream, external_stream );
          return error;
        }
      }

      if ( FT_ERR_NEQ( error, Unknown_File_Format ) )
        goto Fail2;
#endif  /* !FT_MACINTOSH && FT_CONFIG_OPTION_MAC_FONTS */

      /* no driver is able to handle this format */
      error = FT_THROW( Unknown_File_Format );

  Fail2:
      FT_Stream_Free( stream, external_stream );
      goto Fail;
    }

  Success:
    FT_TRACE4(( "FT_Open_Face: New face object, adding to list\n" ));

    /* add the face object to its driver's list */
    if ( FT_NEW( node ) )
      goto Fail;

    node->data = face;
    /* don't assume driver is the same as face->driver, so use */
    /* face->driver instead.                                   */
    FT_List_Add( &face->driver->faces_list, node );

    /* now allocate a glyph slot object for the face */
    FT_TRACE4(( "FT_Open_Face: Creating glyph slot\n" ));

    if ( face_index >= 0 )
    {
      error = FT_New_GlyphSlot( face, NULL );
      if ( error )
        goto Fail;

      /* finally, allocate a size object for the face */
      {
        FT_Size  size;


        FT_TRACE4(( "FT_Open_Face: Creating size object\n" ));

        error = FT_New_Size( face, &size );
        if ( error )
          goto Fail;

        face->size = size;
      }
    }

    /* some checks */

    if ( FT_IS_SCALABLE( face ) )
    {
      if ( face->height < 0 )
        face->height = (FT_Short)-face->height;

      if ( !FT_HAS_VERTICAL( face ) )
        face->max_advance_height = (FT_Short)face->height;
    }

    if ( FT_HAS_FIXED_SIZES( face ) )
    {
      FT_Int  i;


      for ( i = 0; i < face->num_fixed_sizes; i++ )
      {
        FT_Bitmap_Size*  bsize = face->available_sizes + i;


        if ( bsize->height < 0 )
          bsize->height = -bsize->height;
        if ( bsize->x_ppem < 0 )
          bsize->x_ppem = -bsize->x_ppem;
        if ( bsize->y_ppem < 0 )
          bsize->y_ppem = -bsize->y_ppem;

        /* check whether negation actually has worked */
        if ( bsize->height < 0 || bsize->x_ppem < 0 || bsize->y_ppem < 0 )
        {
          FT_TRACE0(( "FT_Open_Face:"
                      " Invalid bitmap dimensions for strike %d,"
                      " now disabled\n", i ));
          bsize->width  = 0;
          bsize->height = 0;
          bsize->size   = 0;
          bsize->x_ppem = 0;
          bsize->y_ppem = 0;
        }
      }
    }

    /* initialize internal face data */
    {
      FT_Face_Internal  internal = face->internal;


      internal->transform_matrix.xx = 0x10000L;
      internal->transform_matrix.xy = 0;
      internal->transform_matrix.yx = 0;
      internal->transform_matrix.yy = 0x10000L;

      internal->transform_delta.x = 0;
      internal->transform_delta.y = 0;

      internal->refcount = 1;

      internal->no_stem_darkening = -1;

#ifdef FT_CONFIG_OPTION_SUBPIXEL_RENDERING
      /* Per-face filtering can only be set up by FT_Face_Properties */
      internal->lcd_filter_func = NULL;
#endif
    }

    if ( aface )
      *aface = face;
    else
      FT_Done_Face( face );

    goto Exit;

  Fail:
    if ( node )
      FT_Done_Face( face );    /* face must be in the driver's list */
    else if ( face )
      destroy_face( memory, face, driver );

  Exit:
#ifdef FT_DEBUG_LEVEL_TRACE
    if ( !error && face_index < 0 )
    {
      FT_TRACE3(( "FT_Open_Face: The font has %ld face%s\n"
                  "              and %ld named instance%s for face %ld\n",
                  face->num_faces,
                  face->num_faces == 1 ? "" : "s",
                  face->style_flags >> 16,
                  ( face->style_flags >> 16 ) == 1 ? "" : "s",
                  -face_index - 1 ));
    }
#endif

    FT_TRACE4(( "FT_Open_Face: Return 0x%x\n", error ));

    return error;
  }